

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_request_copy(Terminal *term,int *clipboards,wchar_t n_clipboards)

{
  wchar_t local_20;
  wchar_t i;
  wchar_t n_clipboards_local;
  int *clipboards_local;
  Terminal *term_local;
  
  local_20 = L'\0';
  while( true ) {
    if (n_clipboards <= local_20) {
      return;
    }
    if (clipboards[local_20] == 1) break;
    if (clipboards[local_20] != 0) {
      win_clip_write(term->win,clipboards[local_20],term->last_selected_text,
                     term->last_selected_attr,term->last_selected_tc,
                     (wchar_t)term->last_selected_len,false);
    }
    local_20 = local_20 + L'\x01';
  }
  __assert_fail("clipboards[i] != CLIP_LOCAL",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                ,0x19fc,"void term_request_copy(Terminal *, const int *, int)");
}

Assistant:

void term_request_copy(Terminal *term, const int *clipboards, int n_clipboards)
{
    int i;
    for (i = 0; i < n_clipboards; i++) {
        assert(clipboards[i] != CLIP_LOCAL);
        if (clipboards[i] != CLIP_NULL) {
            win_clip_write(term->win, clipboards[i],
                           term->last_selected_text, term->last_selected_attr,
                           term->last_selected_tc, term->last_selected_len,
                           false);
        }
    }
}